

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FieldMap *this_00;
  ResendRange RVar1;
  bool bVar2;
  int iVar3;
  FieldBase *msgType;
  FieldBase *senderCompID;
  FieldBase *targetCompID;
  FieldBase *sendingTime;
  undefined8 extraout_RAX;
  logic_error *this_01;
  SessionID *sessionID;
  signed_int value;
  signed_int value_00;
  byte bVar4;
  byte local_14c;
  FieldBase *local_140;
  UtcTimeStamp now;
  FieldBase local_110;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (FieldMap *)(ctx + 0x70);
  sessionID = (SessionID *)siglen;
  msgType = FieldMap::getFieldRef(this_00,0x23);
  senderCompID = FieldMap::getFieldRef(this_00,0x31);
  targetCompID = FieldMap::getFieldRef(this_00,0x38);
  sendingTime = FieldMap::getFieldRef(this_00,0x34);
  local_14c = (byte)siglen;
  bVar4 = (byte)sig | local_14c;
  if (bVar4 == 1) {
    local_140 = FieldMap::getFieldRef(this_00,0x22);
  }
  else {
    local_140 = (FieldBase *)0x0;
  }
  bVar2 = validLogonState(this,(MsgType *)msgType);
  if (!bVar2) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"Logon state is not valid for message");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = isGoodTime(this,(SendingTime *)sendingTime);
  if (!bVar2) {
    doBadTime(this,(Message *)ctx);
    return 0;
  }
  bVar2 = isCorrectCompID(this,(SenderCompID *)senderCompID,(TargetCompID *)targetCompID);
  if (!bVar2) {
    doBadCompID(this,(Message *)ctx);
    return 0;
  }
  if ((byte)sig == 0) {
    if (local_14c != 0) goto LAB_001a47a8;
    if (bVar4 == 0) goto LAB_001a48e9;
  }
  else {
    bVar2 = isTargetTooHigh(this,(MsgSeqNum *)local_140);
    if (bVar2) {
      doTargetTooHigh(this,(Message *)ctx);
      return 0;
    }
    if (local_14c != 0) {
LAB_001a47a8:
      bVar2 = isTargetTooLow(this,(MsgSeqNum *)local_140);
      if (bVar2) {
        doTargetTooLow(this,(Message *)ctx);
        return 0;
      }
    }
  }
  if ((this->m_state).m_resendRange.second != 0 || (this->m_state).m_resendRange.first != 0) {
    RVar1 = (this->m_state).m_resendRange;
    iVar3 = IntField::getValue((IntField *)local_140);
    if (RVar1.second <= iVar3) {
      IntConvertor::convert_abi_cxx11_(&local_90,(IntConvertor *)((ulong)RVar1 & 0xffffffff),value);
      std::operator+(&local_70,"ResendRequest for messages FROM: ",&local_90);
      std::operator+(&local_50,&local_70," TO: ");
      IntConvertor::convert_abi_cxx11_(&local_b0,(IntConvertor *)((ulong)RVar1 >> 0x20),value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                     &local_50,&local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                     " has been satisfied.");
      SessionState::onEvent(&this->m_state,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&now);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      (this->m_state).m_resendRange.first = 0;
      (this->m_state).m_resendRange.second = 0;
    }
  }
LAB_001a48e9:
  UtcTimeStamp::UtcTimeStamp(&now);
  (this->m_state).m_lastReceivedTime.super_DateTime.m_date = now.super_DateTime.m_date;
  *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.field_0xc =
       now.super_DateTime._12_4_;
  (this->m_state).m_lastReceivedTime.super_DateTime.m_time = now.super_DateTime.m_time;
  (this->m_state).m_testRequest = 0;
  MsgType::MsgType((MsgType *)&local_110,(MsgType *)msgType);
  fromCallback(this,(MsgType *)&local_110,(Message *)ctx,sessionID);
  FieldBase::~FieldBase(&local_110);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool Session::verify( const Message& msg, bool checkTooHigh,
                      bool checkTooLow )
{
  const MsgType* pMsgType = 0;
  const MsgSeqNum* pMsgSeqNum = 0;

  try
  {
    const Header& header = msg.getHeader();

    pMsgType = FIELD_GET_PTR( header, MsgType );
    const SenderCompID& senderCompID = FIELD_GET_REF( header, SenderCompID );
    const TargetCompID& targetCompID = FIELD_GET_REF( header, TargetCompID );
    const SendingTime& sendingTime = FIELD_GET_REF( header, SendingTime );

    if( checkTooHigh || checkTooLow )
      pMsgSeqNum = FIELD_GET_PTR( header, MsgSeqNum );

    if ( !validLogonState( *pMsgType ) )
      throw std::logic_error( "Logon state is not valid for message" );

    if ( !isGoodTime( sendingTime ) )
    {
      doBadTime( msg );
      return false;
    }
    if ( !isCorrectCompID( senderCompID, targetCompID ) )
    {
      doBadCompID( msg );
      return false;
    }

    if ( checkTooHigh && isTargetTooHigh( *pMsgSeqNum ) )
    {
      doTargetTooHigh( msg );
      return false;
    }
    else if ( checkTooLow && isTargetTooLow( *pMsgSeqNum ) )
    {
      doTargetTooLow( msg );
      return false;
    }

    if ( (checkTooHigh || checkTooLow) && m_state.resendRequested() )
    {
      SessionState::ResendRange range = m_state.resendRange();
 
      if ( *pMsgSeqNum >= range.second )
      {
        m_state.onEvent ("ResendRequest for messages FROM: " +
                         IntConvertor::convert (range.first) + " TO: " +
                         IntConvertor::convert (range.second) +
                         " has been satisfied.");
        m_state.resendRange (0, 0);
      }
    }
  }
  catch ( std::exception& e )
  {
    m_state.onEvent( e.what() );
    disconnect();
    return false;
  }

  UtcTimeStamp now;
  m_state.lastReceivedTime( now );
  m_state.testRequest( 0 );

  fromCallback( pMsgType ? *pMsgType : MsgType(), msg, m_sessionID );
  return true;
}